

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O2

void bfstages(float *ioptr,long M,float *Utbl,long Ustride,long NDiffU,long StageCnt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float *pfVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  ulong local_100;
  ulong local_f8;
  long local_f0;
  float *local_e8;
  float *local_e0;
  float *local_c0;
  float *local_b8;
  long local_b0;
  float *local_a8;
  float *local_a0;
  
  auVar51._8_4_ = 0x80000000;
  auVar51._0_8_ = 0x8000000080000000;
  auVar51._12_4_ = 0x80000000;
  lVar26 = NDiffU << 4;
  uVar23 = (ulong)(1L << (M & 0x3fU)) >> 3;
  uVar19 = uVar23 / (ulong)NDiffU;
  lVar24 = uVar23 * Ustride;
  local_f8 = uVar19 * Ustride;
  local_100 = local_f8 * 2;
  pfVar1 = Utbl + (Ustride << ((ulong)(byte)((char)M - 2) & 0x3f));
  lVar25 = NDiffU;
  local_f0 = NDiffU * 2;
  for (; 0 < StageCnt; StageCnt = StageCnt + -1) {
    local_b0 = local_f8 * 4;
    fVar2 = *Utbl;
    auVar55 = ZEXT464((uint)fVar2);
    fVar3 = *pfVar1;
    fVar4 = Utbl[lVar24];
    auVar56 = ZEXT1664(ZEXT416((uint)fVar2));
    auVar57 = ZEXT1664(ZEXT416((uint)fVar3));
    auVar53 = ZEXT1664(ZEXT416((uint)fVar2));
    auVar54 = ZEXT1664(ZEXT416((uint)fVar3));
    fVar2 = pfVar1[-lVar24];
    uVar21 = NDiffU / 2;
    uVar23 = NDiffU;
    pfVar27 = Utbl;
    local_e8 = ioptr;
    local_e0 = Utbl;
    local_c0 = pfVar1;
    local_b8 = pfVar1;
    local_a8 = pfVar1;
    local_a0 = Utbl;
    while (uVar23 != 0) {
      uVar18 = *(ulong *)(local_e8 + local_f0);
      fVar5 = *local_e8;
      fVar6 = local_e8[1];
      pfVar22 = local_e8;
      uVar20 = uVar19;
      while( true ) {
        uVar20 = uVar20 - 1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar18;
        auVar42 = auVar55._0_16_;
        fVar7 = pfVar22[local_f0 * 2 + 1];
        auVar35 = vfmadd213ss_fma(auVar42,auVar37,ZEXT416((uint)fVar5));
        auVar39 = vmovshdup_avx(auVar37);
        auVar37 = vfmsub213ss_fma(auVar37,ZEXT416((uint)fVar3),ZEXT416((uint)fVar6));
        fVar8 = pfVar22[local_f0 * 2];
        fVar9 = pfVar22[local_f0 * 3 + 1];
        fVar10 = pfVar22[lVar25 * 8 + 1];
        fVar11 = pfVar22[local_f0 + lVar25 * 8];
        fVar12 = pfVar22[local_f0 + lVar25 * 8 + 1];
        fVar13 = pfVar22[local_f0 * 2 + lVar25 * 8];
        fVar14 = pfVar22[local_f0 * 2 + lVar25 * 8 + 1];
        fVar15 = pfVar22[local_f0 * 3 + lVar25 * 8];
        fVar16 = pfVar22[local_f0 * 3 + lVar25 * 8 + 1];
        auVar35 = vfmadd231ss_fma(auVar35,auVar39,ZEXT416((uint)fVar3));
        auVar34 = vfmsub231ss_fma(auVar37,auVar42,auVar39);
        fVar17 = pfVar22[lVar25 * 8];
        auVar28 = vmulss_avx512f(ZEXT416((uint)pfVar22[local_f0 * 3]),auVar42);
        auVar50 = SUB6416(ZEXT464(0x40000000),0);
        auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar50,auVar35);
        auVar37 = vfmsub213ss_fma(ZEXT416((uint)fVar6),auVar50,auVar34);
        auVar36 = ZEXT416((uint)fVar3);
        auVar29 = vfmadd213ss_avx512f(ZEXT416((uint)pfVar22[local_f0 * 3]),auVar36,
                                      ZEXT416((uint)fVar7));
        auVar30 = vaddss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
        auVar31 = vaddss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
        auVar32 = vaddss_avx512f(auVar35,auVar35);
        auVar33 = vaddss_avx512f(auVar34,auVar34);
        auVar40 = ZEXT416((uint)fVar3);
        auVar45 = auVar56._0_16_;
        auVar46 = auVar57._0_16_;
        auVar52 = auVar53._0_16_;
        auVar49 = auVar54._0_16_;
        if (uVar20 == 0) break;
        auVar28 = vfnmsub231ss_avx512f(auVar28,auVar40,ZEXT416((uint)fVar9));
        auVar29 = vfnmadd231ss_avx512f(auVar29,auVar42,ZEXT416((uint)fVar9));
        auVar28 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar28);
        auVar30 = vsubss_avx512f(auVar30,auVar29);
        auVar31 = vsubss_avx512f(auVar31,auVar28);
        auVar34 = vfmsub231ss_avx512f(auVar34,auVar46,auVar31);
        auVar35 = vfmadd231ss_avx512f(auVar35,auVar31,auVar45);
        auVar34 = vfmsub231ss_avx512f(auVar34,auVar45,auVar30);
        auVar35 = vfmadd231ss_avx512f(auVar35,auVar30,auVar46);
        auVar30 = vsubss_avx512f(auVar33,auVar34);
        auVar31 = vfmadd213ss_avx512f(auVar46,auVar28,auVar39);
        auVar28 = vfmadd213ss_avx512f(auVar28,auVar45,auVar37);
        auVar32 = vsubss_avx512f(auVar32,auVar35);
        auVar31 = vfnmadd231ss_avx512f(auVar31,auVar45,auVar29);
        auVar28 = vfmadd231ss_avx512f(auVar28,auVar46,auVar29);
        auVar29 = vfmadd213ss_avx512f(auVar42,ZEXT416((uint)fVar11),ZEXT416((uint)fVar17));
        auVar33 = vfmsub213ss_avx512f(ZEXT416((uint)fVar11),auVar40,ZEXT416((uint)fVar10));
        auVar29 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)fVar12),auVar40);
        auVar33 = vfmsub231ss_avx512f(auVar33,auVar42,ZEXT416((uint)fVar12));
        auVar36 = vmulss_avx512f(auVar40,ZEXT416((uint)fVar16));
        auVar37 = vfmsub213ss_avx512f(auVar37,auVar50,auVar28);
        auVar38 = vfmsub213ss_avx512f(auVar39,auVar50,auVar31);
        auVar39 = vfnmsub231ss_avx512f(auVar36,ZEXT416((uint)fVar15),auVar42);
        auVar36 = vfmadd213ss_avx512f(ZEXT416((uint)fVar15),auVar40,ZEXT416((uint)fVar14));
        auVar40 = vfmsub213ss_avx512f(ZEXT416((uint)fVar17),auVar50,auVar29);
        auVar41 = vfmsub213ss_avx512f(ZEXT416((uint)fVar10),auVar50,auVar33);
        auVar39 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar39);
        auVar36 = vfnmadd231ss_avx512f(auVar36,auVar42,ZEXT416((uint)fVar16));
        auVar42 = vfmsub213ss_avx512f(ZEXT416((uint)fVar13),auVar50,auVar39);
        auVar43 = vfmsub213ss_avx512f(ZEXT416((uint)fVar14),auVar50,auVar36);
        auVar44 = vfmadd213ss_avx512f(auVar45,auVar42,auVar29);
        auVar42 = vfmsub213ss_avx512f(auVar42,auVar46,auVar33);
        auVar44 = vfmadd231ss_avx512f(auVar44,auVar43,auVar46);
        auVar42 = vfmsub231ss_avx512f(auVar42,auVar45,auVar43);
        auVar43 = vfmadd213ss_avx512f(auVar46,auVar39,auVar40);
        auVar39 = vfmadd213ss_avx512f(auVar39,auVar45,auVar41);
        auVar45 = vfnmadd231ss_avx512f(auVar43,auVar45,auVar36);
        auVar36 = vfmadd231ss_avx512f(auVar39,auVar46,auVar36);
        auVar39 = vmulss_avx512f(auVar52,auVar44);
        auVar29 = vfmsub213ss_avx512f(auVar29,auVar50,auVar44);
        auVar46 = vfmadd213ss_avx512f(auVar44,auVar49,auVar34);
        auVar33 = vfmsub213ss_avx512f(auVar33,auVar50,auVar42);
        auVar39 = vfnmsub231ss_avx512f(auVar39,auVar42,auVar49);
        auVar40 = vfmsub213ss_avx512f(auVar40,auVar50,auVar45);
        auVar41 = vfmsub213ss_avx512f(auVar41,auVar50,auVar36);
        auVar42 = vfnmadd231ss_avx512f(auVar46,auVar52,auVar42);
        auVar46 = vaddss_avx512f(auVar35,auVar39);
        auVar43 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar40);
        auVar39 = vfmadd213ss_fma(auVar40,ZEXT416((uint)fVar2),auVar37);
        auVar34 = vfmsub213ss_avx512f(auVar34,auVar50,auVar42);
        auVar35 = vfmsub213ss_avx512f(auVar35,auVar50,auVar46);
        pfVar22[lVar25 * 8] = auVar46._0_4_;
        auVar40 = vfnmsub231ss_avx512f(auVar43,auVar41,ZEXT416((uint)fVar2));
        auVar46 = vfnmadd231ss_avx512f(auVar39,ZEXT416((uint)fVar4),auVar41);
        auVar39 = vmulss_avx512f(ZEXT416((uint)fVar4),auVar45);
        auVar40 = vaddss_avx512f(auVar38,auVar40);
        auVar41 = vfnmsub231ss_avx512f(auVar39,ZEXT416((uint)fVar2),auVar36);
        auVar39 = vfmsub213ss_fma(auVar37,auVar50,auVar46);
        pfVar22[local_f0 + lVar25 * 8] = auVar40._0_4_;
        pfVar22[lVar25 * 8 + 1] = auVar42._0_4_;
        pfVar22[local_f0 + lVar25 * 8 + 1] = auVar46._0_4_;
        auVar42 = vfmsub213ss_avx512f(auVar49,auVar29,auVar32);
        *pfVar22 = auVar35._0_4_;
        auVar35 = vmulss_avx512f(auVar52,auVar29);
        auVar29 = vfmsub213ss_avx512f(auVar38,auVar50,auVar40);
        auVar40 = vaddss_avx512f(auVar28,auVar41);
        auVar37 = vfnmsub231ss_fma(auVar35,auVar49,auVar33);
        auVar35 = vfmsub231ss_fma(auVar42,auVar33,auVar52);
        auVar33 = vfmsub213ss_avx512f(ZEXT416((uint)fVar2),auVar45,auVar31);
        pfVar22[local_f0] = auVar29._0_4_;
        pfVar22[1] = auVar34._0_4_;
        pfVar22[local_f0 + 1] = auVar39._0_4_;
        auVar39 = vfmsub213ss_avx512f(auVar28,auVar50,auVar40);
        fVar5 = pfVar22[lVar26];
        fVar6 = pfVar22[lVar26 + 1];
        uVar18 = *(ulong *)(pfVar22 + local_f0 + lVar26);
        auVar37 = vaddss_avx512f(auVar30,auVar37);
        auVar34 = vfmsub231ss_avx512f(auVar33,auVar36,ZEXT416((uint)fVar4));
        auVar28 = vfmsub213ss_avx512f(auVar32,auVar50,auVar35);
        pfVar22[local_f0 * 2] = auVar35._0_4_;
        auVar35 = vfmsub213ss_avx512f(auVar30,auVar50,auVar37);
        auVar29 = vfmsub213ss_avx512f(auVar31,auVar50,auVar34);
        pfVar22[local_f0 * 3] = auVar34._0_4_;
        pfVar22[local_f0 * 2 + 1] = auVar37._0_4_;
        pfVar22[local_f0 * 3 + 1] = auVar40._0_4_;
        pfVar22[local_f0 * 2 + lVar25 * 8] = auVar28._0_4_;
        pfVar22[local_f0 * 3 + lVar25 * 8] = auVar29._0_4_;
        pfVar22[local_f0 * 2 + lVar25 * 8 + 1] = auVar35._0_4_;
        pfVar22[local_f0 * 3 + lVar25 * 8 + 1] = auVar39._0_4_;
        pfVar22 = pfVar22 + lVar26;
      }
      auVar28 = vfnmsub231ss_avx512f(auVar28,ZEXT416((uint)fVar9),auVar36);
      auVar29 = vfnmadd231ss_avx512f(auVar29,auVar42,ZEXT416((uint)fVar9));
      auVar28 = vaddss_avx512f(ZEXT416((uint)fVar8),auVar28);
      auVar30 = vsubss_avx512f(auVar30,auVar29);
      auVar31 = vsubss_avx512f(auVar31,auVar28);
      auVar35 = vfmadd231ss_avx512f(auVar35,auVar31,auVar45);
      auVar34 = vfmsub231ss_avx512f(auVar34,auVar46,auVar31);
      auVar31 = vfmadd213ss_avx512f(auVar46,auVar28,auVar39);
      auVar28 = vfmadd213ss_avx512f(auVar28,auVar45,auVar37);
      if (uVar23 == uVar21) {
        local_b0 = -local_b0;
      }
      local_e8 = local_e8 + 2;
      local_a8 = local_a8 + -local_b0;
      auVar31 = vfnmadd231ss_avx512f(auVar31,auVar29,auVar45);
      auVar28 = vfmadd231ss_avx512f(auVar28,auVar46,auVar29);
      auVar29 = vfmadd213ss_avx512f(auVar42,ZEXT416((uint)fVar11),ZEXT416((uint)fVar17));
      auVar38 = vfmsub213ss_avx512f(ZEXT416((uint)fVar11),auVar36,ZEXT416((uint)fVar10));
      auVar34 = vfmsub231ss_avx512f(auVar34,auVar45,auVar30);
      auVar30 = vfmadd231ss_avx512f(auVar35,auVar30,auVar46);
      auVar29 = vfmadd231ss_avx512f(auVar29,ZEXT416((uint)fVar12),auVar36);
      auVar36 = vfmsub231ss_avx512f(auVar38,auVar42,ZEXT416((uint)fVar12));
      auVar35 = vmulss_avx512f(ZEXT416((uint)fVar16),auVar40);
      auVar40 = vfmadd213ss_avx512f(auVar40,ZEXT416((uint)fVar15),ZEXT416((uint)fVar14));
      local_a0 = local_a0 + local_b0;
      auVar38 = vfmsub213ss_avx512f(auVar37,auVar50,auVar28);
      auVar32 = vsubss_avx512f(auVar32,auVar30);
      auVar33 = vsubss_avx512f(auVar33,auVar34);
      auVar41 = vfmsub213ss_avx512f(auVar39,auVar50,auVar31);
      auVar39 = vfnmsub231ss_avx512f(auVar35,ZEXT416((uint)fVar15),auVar42);
      auVar35 = vfnmadd231ss_avx512f(auVar40,ZEXT416((uint)fVar16),auVar42);
      auVar40 = vfmsub213ss_avx512f(ZEXT416((uint)fVar17),auVar50,auVar29);
      auVar42 = vfmsub213ss_avx512f(ZEXT416((uint)fVar10),auVar50,auVar36);
      pfVar27 = pfVar27 + local_100;
      auVar39 = vaddss_avx512f(ZEXT416((uint)fVar13),auVar39);
      auVar43 = vfmsub213ss_avx512f(ZEXT416((uint)fVar14),auVar50,auVar35);
      auVar37 = vfmsub213ss_avx512f(ZEXT416((uint)fVar13),auVar50,auVar39);
      auVar44 = vfmadd213ss_avx512f(auVar46,auVar39,auVar40);
      local_b8 = local_b8 + -local_100;
      auVar47 = vfmadd213ss_avx512f(auVar45,auVar37,auVar29);
      auVar48 = vfmsub213ss_avx512f(auVar37,auVar46,auVar36);
      auVar37 = vfnmadd231ss_fma(auVar44,auVar35,auVar45);
      local_e0 = local_e0 + local_f8;
      auVar44 = vfmsub231ss_avx512f(auVar48,auVar45,auVar43);
      auVar45 = vfmadd213ss_avx512f(auVar45,auVar39,auVar42);
      auVar43 = vfmadd231ss_avx512f(auVar47,auVar43,auVar46);
      auVar39 = vfmsub213ss_fma(auVar40,auVar50,auVar37);
      auVar48 = ZEXT416((uint)fVar4);
      auVar40 = vmulss_avx512f(auVar37,auVar48);
      auVar35 = vfmadd231ss_fma(auVar45,auVar46,auVar35);
      auVar45 = vmulss_avx512f(auVar39,auVar48);
      auVar29 = vfmsub213ss_avx512f(auVar29,auVar50,auVar43);
      auVar47 = ZEXT416((uint)fVar2);
      auVar39 = vfmadd213ss_fma(auVar39,auVar47,auVar38);
      auVar36 = vfmsub213ss_avx512f(auVar36,auVar50,auVar44);
      local_c0 = local_c0 + -local_f8;
      auVar57 = ZEXT464((uint)*local_b8);
      auVar42 = vfmsub213ss_avx512f(auVar42,auVar50,auVar35);
      auVar40 = vfnmsub231ss_avx512f(auVar40,auVar47,auVar35);
      auVar46 = vmulss_avx512f(auVar29,auVar52);
      fVar3 = *local_a8;
      auVar46 = vfnmsub231ss_avx512f(auVar46,auVar49,auVar36);
      auVar45 = vfnmsub231ss_avx512f(auVar45,auVar42,auVar47);
      auVar37 = vfmsub213ss_avx512f(auVar47,auVar37,auVar31);
      auVar47 = vxorps_avx512vl(ZEXT416((uint)*local_a0),auVar51);
      auVar42 = vfnmadd231ss_avx512f(auVar39,auVar48,auVar42);
      auVar55 = ZEXT1664(CONCAT124(auVar47._4_12_,
                                   (uint)(uVar21 < uVar23) * (int)*local_a0 +
                                   (uint)(uVar21 >= uVar23) * auVar47._0_4_));
      auVar39 = vmulss_avx512f(auVar43,auVar52);
      auVar43 = vfmadd213ss_avx512f(auVar43,auVar49,auVar34);
      auVar47 = vfnmsub231ss_avx512f(auVar39,auVar44,auVar49);
      auVar29 = vfmsub213ss_avx512f(auVar49,auVar29,auVar32);
      auVar35 = vfmsub231ss_fma(auVar37,auVar35,auVar48);
      auVar56 = ZEXT464((uint)*pfVar27);
      auVar40 = vaddss_avx512f(auVar28,auVar40);
      auVar39 = vfmsub213ss_fma(auVar38,auVar50,auVar42);
      auVar49 = vfnmadd231ss_avx512f(auVar43,auVar52,auVar44);
      auVar28 = vfmsub213ss_avx512f(auVar28,auVar50,auVar40);
      auVar38 = vaddss_avx512f(auVar30,auVar47);
      auVar37 = vfmsub231ss_fma(auVar29,auVar36,auVar52);
      auVar29 = vaddss_avx512f(auVar33,auVar46);
      auVar31 = vfmsub213ss_avx512f(auVar31,auVar50,auVar35);
      auVar34 = vfmsub213ss_avx512f(auVar34,auVar50,auVar49);
      auVar30 = vfmsub213ss_avx512f(auVar30,auVar50,auVar38);
      pfVar22[lVar25 * 8] = auVar38._0_4_;
      auVar33 = vfmsub213ss_avx512f(auVar33,auVar50,auVar29);
      pfVar22[local_f0 * 2] = auVar37._0_4_;
      pfVar22[lVar25 * 8 + 1] = auVar49._0_4_;
      pfVar22[local_f0 * 2 + 1] = auVar29._0_4_;
      auVar37 = vfmsub213ss_avx512f(auVar32,auVar50,auVar37);
      auVar53 = ZEXT464((uint)*local_e0);
      auVar54 = ZEXT464((uint)*local_c0);
      *pfVar22 = auVar30._0_4_;
      auVar29 = vaddss_avx512f(auVar41,auVar45);
      pfVar22[local_f0 * 2 + lVar25 * 8] = auVar37._0_4_;
      pfVar22[1] = auVar34._0_4_;
      pfVar22[local_f0 * 2 + lVar25 * 8 + 1] = auVar33._0_4_;
      pfVar22[local_f0 + lVar25 * 8] = auVar29._0_4_;
      pfVar22[local_f0 * 3] = auVar35._0_4_;
      pfVar22[local_f0 + lVar25 * 8 + 1] = auVar42._0_4_;
      pfVar22[local_f0 * 3 + 1] = auVar40._0_4_;
      auVar35 = vfmsub213ss_fma(auVar41,auVar50,auVar29);
      fVar4 = local_e0[lVar24];
      fVar2 = local_c0[-lVar24];
      pfVar22[local_f0] = auVar35._0_4_;
      pfVar22[local_f0 * 3 + lVar25 * 8] = auVar31._0_4_;
      pfVar22[local_f0 + 1] = auVar39._0_4_;
      pfVar22[local_f0 * 3 + lVar25 * 8 + 1] = auVar28._0_4_;
      uVar23 = uVar23 - 1;
    }
    local_f8 = local_f8 >> 3;
    local_100 = local_100 >> 3;
    uVar19 = uVar19 >> 3;
    NDiffU = NDiffU << 3;
    lVar26 = lVar26 << 3;
    lVar25 = lVar25 * 8;
    local_f0 = local_f0 * 8;
  }
  return;
}

Assistant:

static inline void bfstages(float *ioptr, long M, float *Utbl, long Ustride, long NDiffU, long StageCnt) {
/***   RADIX 8 Stages	***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long 	NSameU;
unsigned long 	Uinc;
unsigned long 	Uinc2;
unsigned long 	Uinc4;
unsigned long 	DiffUCnt;
unsigned long 	SameUCnt;
unsigned long 	U2toU3;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;
float 	*u0r, *u0i, *u1r, *u1i, *u2r, *u2i;

float w0r, w0i, w1r, w1i, w2r, w2i, w3r, w3i;
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 8;
pos = pinc * 4;
posi =  pos + 1;
NSameU = POW2(M) / 8 /NDiffU;	// 8 pts per butterfly
Uinc = NSameU * Ustride;
Uinc2 = Uinc * 2;
Uinc4 = Uinc * 4;
U2toU3 = (POW2(M) / 8)*Ustride;
for (; StageCnt > 0 ; StageCnt--){

	u0r = &Utbl[0];
	u0i = &Utbl[POW2(M-2)*Ustride];
	u1r = u0r;
	u1i = u0i;
	u2r = u0r;
	u2i = u0i;

	w0r =  *u0r;
	w0i =  *u0i;
	w1r =  *u1r;
	w1i =  *u1i;
	w2r =  *u2r;
	w2i =  *u2i;
	w3r =  *(u2r+U2toU3);
	w3i =  *(u2i-U2toU3);

	pstrt = ioptr;

	p0r = pstrt;
	p1r = pstrt+pinc;
	p2r = p1r+pinc;
	p3r = p2r+pinc;

			/* Butterflys		*/
			/*
			f0	-	-	t0	-	-	f0	-	-	f0
			f1	- w0-	f1	-	-	f1	-	-	f1
			f2	-	-	f2	- w1-	f2	-	-	f4
			f3	- w0-	t1	- iw1-	f3	-	-	f5

			f4	-	-	t0	-	-	f4	- w2-	t0
			f5	- w0-	f5	-	-	f5	- w3-	t1
			f6	-	-	f6	- w1-	f6	- iw2-	f6
			f7	- w0-	t1	- iw1-	f7	- iw3-	f7
			*/

	for (DiffUCnt = NDiffU; DiffUCnt > 0 ; DiffUCnt--){
		f0r = *p0r;
		f0i = *(p0r + 1);
		f1r = *p1r;
		f1i = *(p1r + 1);
		for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){
			f2r = *p2r;
			f2i = *(p2r + 1);
			f3r = *p3r;
			f3i = *(p3r + 1);

			t0r = f0r + f1r * w0r + f1i * w0i;
			t0i = f0i - f1r * w0i + f1i * w0r;
			f1r = f0r * Two - t0r;
			f1i = f0i * Two - t0i;

			f4r = *(p0r + pos);
			f4i = *(p0r + posi);
			f5r = *(p1r + pos);
			f5i = *(p1r + posi);

			f6r = *(p2r + pos);
			f6i = *(p2r + posi);
			f7r = *(p3r + pos);
			f7i = *(p3r + posi);

			t1r = f2r - f3r * w0r - f3i * w0i;
			t1i = f2i + f3r * w0i - f3i * w0r;
			f2r = f2r * Two - t1r;
			f2i = f2i * Two - t1i;

			f0r = t0r + f2r * w1r + f2i * w1i;
			f0i = t0i - f2r * w1i + f2i * w1r;
			f2r = t0r * Two - f0r;
			f2i = t0i * Two - f0i;

			f3r = f1r + t1r * w1i - t1i * w1r;
			f3i = f1i + t1r * w1r + t1i * w1i;
			f1r = f1r * Two - f3r;
			f1i = f1i * Two - f3i;


			t0r = f4r + f5r * w0r + f5i * w0i;
			t0i = f4i - f5r * w0i + f5i * w0r;
			f5r = f4r * Two - t0r;
			f5i = f4i * Two - t0i;

			t1r = f6r - f7r * w0r - f7i * w0i;
			t1i = f6i + f7r * w0i - f7i * w0r;
			f6r = f6r * Two - t1r;
			f6i = f6i * Two - t1i;

			f4r = t0r + f6r * w1r + f6i * w1i;
			f4i = t0i - f6r * w1i + f6i * w1r;
			f6r = t0r * Two - f4r;
			f6i = t0i * Two - f4i;

			f7r = f5r + t1r * w1i - t1i * w1r;
			f7i = f5i + t1r * w1r + t1i * w1i;
			f5r = f5r * Two - f7r;
			f5i = f5i * Two - f7i;

			t0r = f0r - f4r * w2r - f4i * w2i;
			t0i = f0i + f4r * w2i - f4i * w2r;
			f0r = f0r * Two - t0r;
			f0i = f0i * Two - t0i;

			t1r = f1r - f5r * w3r - f5i * w3i;
			t1i = f1i + f5r * w3i - f5i * w3r;
			f1r = f1r * Two - t1r;
			f1i = f1i * Two - t1i;

			*(p0r + pos) = t0r;
			*(p1r + pos) = t1r;
			*(p0r + posi) = t0i;
			*(p1r + posi) = t1i;
			*p0r = f0r;
			*p1r = f1r;
			*(p0r + 1) = f0i;
			*(p1r + 1) = f1i;

			p0r += pnext;
			f0r = *p0r;
			f0i = *(p0r + 1);

			p1r += pnext;

			f1r = *p1r;
			f1i = *(p1r + 1);

			f4r = f2r - f6r * w2i + f6i * w2r;
			f4i = f2i - f6r * w2r - f6i * w2i;
			f6r = f2r * Two - f4r;
			f6i = f2i * Two - f4i;

			f5r = f3r - f7r * w3i + f7i * w3r;
			f5i = f3i - f7r * w3r - f7i * w3i;
			f7r = f3r * Two - f5r;
			f7i = f3i * Two - f5i;

			*p2r = f4r;
			*p3r = f5r;
			*(p2r + 1) = f4i;
			*(p3r + 1) = f5i;
			*(p2r + pos) = f6r;
			*(p3r + pos) = f7r;
			*(p2r + posi) = f6i;
			*(p3r + posi) = f7i;

			p2r += pnext;
			p3r += pnext;

		}
		
		f2r = *p2r;
		f2i = *(p2r + 1);
		f3r = *p3r;
		f3i = *(p3r + 1);

		t0r = f0r + f1r * w0r + f1i * w0i;
		t0i = f0i - f1r * w0i + f1i * w0r;
		f1r = f0r * Two - t0r;
		f1i = f0i * Two - t0i;

		f4r = *(p0r + pos);
		f4i = *(p0r + posi);
		f5r = *(p1r + pos);
		f5i = *(p1r + posi);

		f6r = *(p2r + pos);
		f6i = *(p2r + posi);
		f7r = *(p3r + pos);
		f7i = *(p3r + posi);

		t1r = f2r - f3r * w0r - f3i * w0i;
		t1i = f2i + f3r * w0i - f3i * w0r;
		f2r = f2r * Two - t1r;
		f2i = f2i * Two - t1i;

		f0r = t0r + f2r * w1r + f2i * w1i;
		f0i = t0i - f2r * w1i + f2i * w1r;
		f2r = t0r * Two - f0r;
		f2i = t0i * Two - f0i;

		f3r = f1r + t1r * w1i - t1i * w1r;
		f3i = f1i + t1r * w1r + t1i * w1i;
		f1r = f1r * Two - f3r;
		f1i = f1i * Two - f3i;

		if (DiffUCnt == NDiffU/2)
			Uinc4 = -Uinc4;

		u0r += Uinc4;
		u0i -= Uinc4;
		u1r += Uinc2;
		u1i -= Uinc2;
		u2r += Uinc;
		u2i -= Uinc;

		pstrt += 2;

		t0r = f4r + f5r * w0r + f5i * w0i;
		t0i = f4i - f5r * w0i + f5i * w0r;
		f5r = f4r * Two - t0r;
		f5i = f4i * Two - t0i;

		t1r = f6r - f7r * w0r - f7i * w0i;
		t1i = f6i + f7r * w0i - f7i * w0r;
		f6r = f6r * Two - t1r;
		f6i = f6i * Two - t1i;

		f4r = t0r + f6r * w1r + f6i * w1i;
		f4i = t0i - f6r * w1i + f6i * w1r;
		f6r = t0r * Two - f4r;
		f6i = t0i * Two - f4i;

		f7r = f5r + t1r * w1i - t1i * w1r;
		f7i = f5i + t1r * w1r + t1i * w1i;
		f5r = f5r * Two - f7r;
		f5i = f5i * Two - f7i;

		w0r = *u0r;
		w0i =  *u0i;
		w1r =  *u1r;
		w1i =  *u1i;

		if (DiffUCnt <= NDiffU/2)
			w0r = -w0r;

		t0r = f0r - f4r * w2r - f4i * w2i;
		t0i = f0i + f4r * w2i - f4i * w2r;
		f0r = f0r * Two - t0r;
		f0i = f0i * Two - t0i;

		f4r = f2r - f6r * w2i + f6i * w2r;
		f4i = f2i - f6r * w2r - f6i * w2i;
		f6r = f2r * Two - f4r;
		f6i = f2i * Two - f4i;

		*(p0r + pos) = t0r;
		*p2r = f4r;
		*(p0r + posi) = t0i;
		*(p2r + 1) = f4i;
		w2r =  *u2r;
		w2i =  *u2i;
		*p0r = f0r;
		*(p2r + pos) = f6r;
		*(p0r + 1) = f0i;
		*(p2r + posi) = f6i;

		p0r = pstrt;
		p2r = pstrt + pinc + pinc;	

		t1r = f1r - f5r * w3r - f5i * w3i;
		t1i = f1i + f5r * w3i - f5i * w3r;
		f1r = f1r * Two - t1r;
		f1i = f1i * Two - t1i;

		f5r = f3r - f7r * w3i + f7i * w3r;
		f5i = f3i - f7r * w3r - f7i * w3i;
		f7r = f3r * Two - f5r;
		f7i = f3i * Two - f5i;

		*(p1r + pos) = t1r;
		*p3r = f5r;
		*(p1r + posi) = t1i;
		*(p3r + 1) = f5i;
		w3r =  *(u2r+U2toU3);
		w3i =  *(u2i-U2toU3);
		*p1r = f1r;
		*(p3r + pos) = f7r;
		*(p1r + 1) = f1i;
		*(p3r + posi) = f7i;

		p1r = pstrt + pinc;
		p3r = p2r + pinc;	
	}
	NSameU /= 8;
	Uinc /= 8;
	Uinc2 /= 8;
	Uinc4 = Uinc * 4;
	NDiffU *= 8;
	pinc *= 8;
	pnext *= 8;
	pos *= 8;
	posi =  pos + 1;
}
}